

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dataarray.h
# Opt level: O0

void __thiscall
soplex::
DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
::insert(DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
         *this,int i,int n)

{
  int iVar1;
  int in_EDX;
  int in_ESI;
  DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
  *in_RDI;
  int j;
  int in_stack_ffffffffffffffdc;
  
  iVar1 = in_RDI->thesize;
  reSize(in_RDI,in_stack_ffffffffffffffdc);
  if (in_ESI < iVar1) {
    memmove(in_RDI->data + (in_ESI + in_EDX),in_RDI->data + in_ESI,
            (ulong)(uint)(iVar1 - in_ESI) << 2);
  }
  return;
}

Assistant:

void insert(int i, int n)
   {
      int j = thesize;

      assert(i >= 0);
      assert(n >= 0);

      reSize(thesize + n);

      /// move \p n elements in memory from insert position \p i to the back
      if(j > i)
         memmove(&(data[i + n]), &(data[i]), (unsigned int)(j - i) * sizeof(T));
   }